

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RelationsAnalyzer.cpp
# Opt level: O1

void dg::vr::RelationsAnalyzer::remGen(ValueRelations *graph,BinaryOperator *rem)

{
  Relations RVar1;
  Constant *zero;
  BinaryOperator *local_28;
  V local_20;
  Value *local_18;
  
  local_28 = rem;
  local_20 = (V)llvm::ConstantInt::getSigned(*(Type **)rem,0);
  RVar1 = ValueRelations::_between(graph,local_20,*(V *)(local_28 + -0x40));
  if (((ulong)RVar1.bits.super__Base_bitset<1UL>._M_w & 4) != 0) {
    ValueRelations::set<llvm::Constant_const*,llvm::BinaryOperator_const*>
              (graph,(Constant **)&local_20,SLE,&local_28);
    local_18 = *(Value **)(local_28 + -0x20);
    ValueRelations::set<llvm::BinaryOperator_const*,llvm::Value*>(graph,&local_28,SLT,&local_18);
  }
  return;
}

Assistant:

void RelationsAnalyzer::remGen(ValueRelations &graph,
                               const llvm::BinaryOperator *rem) {
    assert(rem);
    const llvm::Constant *zero =
            llvm::ConstantInt::getSigned(rem->getType(), 0);

    if (!graph.isLesserEqual(zero, rem->getOperand(0)))
        return;

    graph.setLesserEqual(zero, rem);
    graph.setLesser(rem, rem->getOperand(1));
}